

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Shader::~Shader(Shader *this)

{
  (*this->m_gl->deleteShader)(this->m_shader);
  ShaderInfo::~ShaderInfo(&this->m_info);
  return;
}

Assistant:

Shader::~Shader (void)
{
	m_gl.deleteShader(m_shader);
}